

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_list(int argc,long argv)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int in_stack_000006a0;
  int in_stack_000006a4;
  int stat;
  fitsfile *infptr;
  int hdunum;
  LONGLONG sizell;
  char infits [513];
  char msg [513];
  
  stat = 0;
  if (in_stack_000006a4 != 0x2a) {
    pcVar2 = "Error: internal initialization error\n";
LAB_00103f53:
    fp_msg(pcVar2);
LAB_00103f8d:
    exit(-1);
  }
  lVar3 = (long)in_stack_000006a0;
  do {
    if (argc <= lVar3) {
      return 0;
    }
    strncpy(infits,*(char **)(argv + lVar3 * 8),0x200);
    infits[0x200] = '\0';
    pcVar2 = strchr(infits,0x5b);
    if (pcVar2 != (char *)0x0) {
LAB_00103f36:
      fp_msg("Error: section/extension notation not supported: ");
      fp_msg(infits);
      pcVar2 = "\n";
      goto LAB_00103f53;
    }
    pcVar2 = strchr(infits,0x5d);
    if (pcVar2 != (char *)0x0) goto LAB_00103f36;
    iVar1 = fp_access(infits);
    if (iVar1 != 0) {
      fp_msg("Error: can\'t find or read input file ");
      fp_msg(infits);
      fp_msg("\n");
      fp_noop();
      goto LAB_00103f8d;
    }
    ffopentest(10,&infptr,infits,0,&stat);
    if (stat != 0) break;
    ffthdu(infptr,&hdunum,&stat);
    ffmahd(infptr,hdunum,0,&stat);
    ffghadll(infptr,0,0,&sizell,&stat);
    if (stat != 0) {
      fp_abort_output(infptr,(fitsfile *)0x0,stat);
    }
    snprintf(msg,0x201,"# %s (",infits);
    fp_msg(msg);
    snprintf(msg,0x201,"%lld bytes)\n");
    fp_msg(msg);
    fp_info_hdu(infptr);
    ffclos(infptr,&stat);
    lVar3 = lVar3 + 1;
  } while (stat == 0);
  ffrprt(_stderr);
  exit(stat);
}

Assistant:

int fp_list (int argc, char *argv[], fpstate fpvar)
{
	fitsfile *infptr;
	char	infits[SZ_STR], msg[SZ_STR];
	int	hdunum, iarg, stat=0;
	LONGLONG sizell;

	if (fpvar.initialized != FP_INIT_MAGIC) {
	    fp_msg ("Error: internal initialization error\n"); exit (-1);
	}

	for (iarg=fpvar.firstfile; iarg < argc; iarg++) {
	    strncpy (infits, argv[iarg], SZ_STR-1);
            infits[SZ_STR-1]=0;

	    if (strchr (infits, '[') || strchr (infits, ']')) {
		fp_msg ("Error: section/extension notation not supported: ");
		fp_msg (infits); fp_msg ("\n"); exit (-1);
	    }

	    if (fp_access (infits) != 0) {
		        fp_msg ("Error: can't find or read input file "); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
	    }

	    fits_open_file (&infptr, infits, READONLY, &stat);
	    if (stat) { fits_report_error (stderr, stat); exit (stat); }

	    /* move to the end of file, to get the total size in bytes */
	    fits_get_num_hdus (infptr, &hdunum, &stat);
	    fits_movabs_hdu (infptr, hdunum, NULL, &stat);
	    fits_get_hduaddrll(infptr, NULL, NULL, &sizell, &stat);


	    if (stat) { 
	        fp_abort_output(infptr, NULL, stat);
	    }

            snprintf (msg, SZ_STR,"# %s (", infits); fp_msg (msg);

#if defined(_MSC_VER)
    /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
        snprintf(msg, SZ_STR,"%I64d bytes)\n", sizell); fp_msg (msg);
#elif (USE_LL_SUFFIX == 1)
        snprintf(msg, SZ_STR,"%lld bytes)\n", sizell); fp_msg (msg);
#else
        snprintf(msg, SZ_STR,"%ld bytes)\n", sizell); fp_msg (msg);
#endif
	    fp_info_hdu (infptr);

	    fits_close_file (infptr, &stat);
	    if (stat) { fits_report_error (stderr, stat); exit (stat); }
	}
	return(0);
}